

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O1

const_iterator __thiscall
QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
::find(QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
       *this,DBusKey *key)

{
  DBusKey *pDVar1;
  bool bVar2;
  const_iterator cVar3;
  long lVar4;
  qsizetype qVar5;
  const_iterator cVar6;
  
  pDVar1 = (this->c).keys.d.ptr;
  cVar3 = std::
          __lower_bound<QList<QDBusListener::DBusKey>::const_iterator,QDBusListener::DBusKey,__gnu_cxx::__ops::_Iter_comp_val<std::less<QDBusListener::DBusKey>>>
                    (pDVar1,pDVar1 + (this->c).keys.d.size,key);
  pDVar1 = (this->c).keys.d.ptr;
  lVar4 = (long)cVar3.i - (long)pDVar1;
  qVar5 = (lVar4 >> 4) * -0x5555555555555555;
  if (qVar5 - (this->c).keys.d.size != 0) {
    bVar2 = QDBusListener::DBusKey::operator<(key,(DBusKey *)((long)pDVar1 + lVar4));
    if (bVar2) {
      qVar5 = (this->c).keys.d.size;
    }
  }
  cVar6.i = qVar5;
  cVar6.c = &this->c;
  return cVar6;
}

Assistant:

const_iterator find(const Key &key) const
    {
        auto it = lower_bound(key);
        if (it != end()) {
            if (!key_compare::operator()(key, it.key()))
                return it;
            it = end();
        }
        return it;
    }